

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O0

int32_t op_shift_right_unsigned(int32_t value,int32_t amount)

{
  int32_t amount_local;
  int32_t value_local;
  
  amount_local = value;
  if (amount != 0) {
    if ((value == 0) || (amount < -0x1f)) {
      amount_local = 0;
    }
    else if (amount < 0x20) {
      if (amount < 0) {
        amount_local = op_shift_left(value,-amount);
      }
      else {
        amount_local = (uint)value >> ((byte)amount & 0x1f);
      }
    }
    else {
      amount_local = 0;
      if (value < 0) {
        amount_local = -1;
      }
    }
  }
  return amount_local;
}

Assistant:

int32_t op_shift_right_unsigned(int32_t value, int32_t amount)
{
	// Repeat the easy cases here to avoid INT_MIN funny business
	if (amount == 0)
		return value;
	if (value == 0 || amount <= -32)
		return 0;
	if (amount > 31)
		return (value < 0) ? -1 : 0;
	if (amount < 0)
		return op_shift_left(value, -amount);

	return (uint32_t)value >> amount;
}